

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O0

void Abc_BufCollectTfoCone_rec(Abc_Obj_t *pNode,Vec_Int_t *vNodes)

{
  int iVar1;
  uint Entry;
  Abc_Obj_t *pNode_00;
  int local_24;
  int i;
  Abc_Obj_t *pNext;
  Vec_Int_t *vNodes_local;
  Abc_Obj_t *pNode_local;
  
  iVar1 = Abc_NodeIsTravIdCurrent(pNode);
  if (iVar1 == 0) {
    Abc_NodeSetTravIdCurrent(pNode);
    iVar1 = Abc_ObjIsCo(pNode);
    if (iVar1 == 0) {
      iVar1 = Abc_ObjIsCi(pNode);
      if ((iVar1 == 0) && (iVar1 = Abc_ObjIsNode(pNode), iVar1 == 0)) {
        __assert_fail("Abc_ObjIsCi(pNode) || Abc_ObjIsNode(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclBuffer.c"
                      ,0x24d,"void Abc_BufCollectTfoCone_rec(Abc_Obj_t *, Vec_Int_t *)");
      }
      for (local_24 = 0; iVar1 = Abc_ObjFanoutNum(pNode), local_24 < iVar1; local_24 = local_24 + 1)
      {
        pNode_00 = Abc_ObjFanout(pNode,local_24);
        Abc_BufCollectTfoCone_rec(pNode_00,vNodes);
      }
      iVar1 = Abc_ObjIsNode(pNode);
      if (iVar1 != 0) {
        Entry = Abc_ObjId(pNode);
        Vec_IntPush(vNodes,Entry);
      }
    }
  }
  return;
}

Assistant:

void Abc_BufCollectTfoCone_rec( Abc_Obj_t * pNode, Vec_Int_t * vNodes )
{
    Abc_Obj_t * pNext;
    int i;
    if ( Abc_NodeIsTravIdCurrent( pNode ) )
        return;
    Abc_NodeSetTravIdCurrent( pNode );
    if ( Abc_ObjIsCo(pNode) )
        return;
    assert( Abc_ObjIsCi(pNode) || Abc_ObjIsNode(pNode) );
    Abc_ObjForEachFanout( pNode, pNext, i )
        Abc_BufCollectTfoCone_rec( pNext, vNodes );
    if ( Abc_ObjIsNode(pNode) )
        Vec_IntPush( vNodes, Abc_ObjId(pNode) );
}